

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool wabt::anon_unknown_1::IsCommand(TokenTypePair pair)

{
  value_type vVar1;
  reference pvVar2;
  array<wabt::TokenType,_2UL> local_14;
  TokenTypePair pair_local;
  
  local_14._M_elems = pair._M_elems;
  pvVar2 = std::array<wabt::TokenType,_2UL>::operator[](&local_14,0);
  if (*pvVar2 == Lpar) {
    pvVar2 = std::array<wabt::TokenType,_2UL>::operator[](&local_14,1);
    vVar1 = *pvVar2;
    if ((((vVar1 - AssertExhaustion < 6) || (vVar1 == Get)) || (vVar1 - Invoke < 2)) ||
       (((vVar1 == Module || (vVar1 == Output)) || (vVar1 == Register)))) {
      pair_local._M_elems[0]._3_1_ = 1;
    }
    else {
      pair_local._M_elems[0]._3_1_ = First >> 0x18;
    }
  }
  else {
    pair_local._M_elems[0]._3_1_ = First >> 0x18;
  }
  return (bool)pair_local._M_elems[0]._3_1_;
}

Assistant:

bool IsCommand(TokenTypePair pair) {
  if (pair[0] != TokenType::Lpar) {
    return false;
  }

  switch (pair[1]) {
    case TokenType::AssertExhaustion:
    case TokenType::AssertInvalid:
    case TokenType::AssertMalformed:
    case TokenType::AssertReturn:
    case TokenType::AssertTrap:
    case TokenType::AssertUnlinkable:
    case TokenType::Get:
    case TokenType::Invoke:
    case TokenType::Input:
    case TokenType::Module:
    case TokenType::Output:
    case TokenType::Register:
      return true;
    default:
      return false;
  }
}